

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O2

void flatbuffers::tests::ParseUnionTest(void)

{
  bool bVar1;
  IDLOptions IStack_1998;
  Parser parser3;
  Parser parser2;
  Parser parser;
  
  IDLOptions::IDLOptions((IDLOptions *)&parser2);
  Parser::Parser(&parser,(IDLOptions *)&parser2);
  IDLOptions::~IDLOptions((IDLOptions *)&parser2);
  bVar1 = Parser::Parse(&parser,
                        "table T { A:int; }union U { T }table V { X:U; }root_type V;{ X:{ A:1 }, X_type: T }"
                        ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser.Parse(\"table T { A:int; }\" \"union U { T }\" \"table V { X:U; }\" \"root_type V;\" \"{ X:{ A:1 }, X_type: T }\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x345,"");
  IDLOptions::IDLOptions((IDLOptions *)&parser3);
  Parser::Parser(&parser2,(IDLOptions *)&parser3);
  IDLOptions::~IDLOptions((IDLOptions *)&parser3);
  bVar1 = Parser::Parse(&parser2,
                        "namespace N; table A {} namespace; union U { N.A }table B { e:U; } root_type B;{ e_type: N_A, e: {} }"
                        ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,
                    "\'parser2.Parse(\"namespace N; table A {} namespace; union U { N.A }\" \"table B { e:U; } root_type B;\" \"{ e_type: N_A, e: {} }\")\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x34b,"");
  IDLOptions::IDLOptions(&IStack_1998);
  Parser::Parser(&parser3,&IStack_1998);
  IDLOptions::~IDLOptions(&IStack_1998);
  parser3.opts.lang_to_generate = 0x208;
  bVar1 = Parser::Parse(&parser3,
                        "table A {} table B {} union U : int {A, B} table C {test_union: U; test_vector_of_union: [U];}"
                        ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,"\'parser3.Parse(source)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x351,"");
  parser3.opts.lang_to_generate = parser3.opts.lang_to_generate & 1;
  bVar1 = Parser::Parse(&parser3,
                        "table A {} table B {} union U : int {A, B} table C {test_union: U; test_vector_of_union: [U];}"
                        ,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,false,"\'parser3.Parse(source)\' != \'false\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/parser_test.cpp"
                    ,0x354,"");
  Parser::~Parser(&parser3);
  Parser::~Parser(&parser2);
  Parser::~Parser(&parser);
  return;
}

Assistant:

void ParseUnionTest() {
  // Unions must be parseable with the type field following the object.
  flatbuffers::Parser parser;
  TEST_EQ(parser.Parse("table T { A:int; }"
                       "union U { T }"
                       "table V { X:U; }"
                       "root_type V;"
                       "{ X:{ A:1 }, X_type: T }"),
          true);
  // Unions must be parsable with prefixed namespace.
  flatbuffers::Parser parser2;
  TEST_EQ(parser2.Parse("namespace N; table A {} namespace; union U { N.A }"
                        "table B { e:U; } root_type B;"
                        "{ e_type: N_A, e: {} }"),
          true);

  // Test union underlying type
  const char *source = "table A {} table B {} union U : int {A, B} table C {test_union: U; test_vector_of_union: [U];}";
  flatbuffers::Parser parser3;
  parser3.opts.lang_to_generate = flatbuffers::IDLOptions::kCpp | flatbuffers::IDLOptions::kTs;
  TEST_EQ(parser3.Parse(source), true);
  
  parser3.opts.lang_to_generate &= flatbuffers::IDLOptions::kJava;
  TEST_EQ(parser3.Parse(source), false);
}